

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O3

void readheader(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int status;
  fitsfile *fptr;
  int nkeys;
  int hdutype;
  int keypos;
  char filename [13];
  char card [81];
  int local_b4;
  undefined8 local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  undefined1 local_9c [4];
  undefined5 local_98;
  undefined3 uStack_93;
  undefined5 uStack_90;
  char local_88 [88];
  
  uStack_90 = 0x7469662e;
  local_98 = 0x7473657461;
  uStack_93 = 0x6c6966;
  local_b4 = 0;
  iVar1 = ffopentest(10,&local_b0,&local_98,0);
  if (iVar1 != 0) {
    printerror(local_b4);
  }
  uVar3 = 1;
  iVar1 = ffmahd(local_b0,1,local_a0,&local_b4);
  if (iVar1 == 0) {
    do {
      iVar1 = ffghps(local_b0,&local_a4,local_9c,&local_b4);
      if (iVar1 != 0) {
        printerror(local_b4);
      }
      printf("Header listing for HDU #%d:\n",(ulong)uVar3);
      if (0 < local_a4) {
        iVar1 = 0;
        do {
          iVar1 = iVar1 + 1;
          iVar2 = ffgrec(local_b0,iVar1,local_88,&local_b4);
          if (iVar2 != 0) {
            printerror(local_b4);
          }
          puts(local_88);
        } while (iVar1 < local_a4);
      }
      puts("END\n");
      uVar3 = uVar3 + 1;
      iVar1 = ffmahd(local_b0,uVar3,local_a0,&local_b4);
    } while (iVar1 == 0);
  }
  if (local_b4 == 0x6b) {
    local_b4 = 0;
  }
  else {
    printerror(local_b4);
  }
  iVar1 = ffclos(local_b0,&local_b4);
  if (iVar1 != 0) {
    printerror(local_b4);
  }
  return;
}

Assistant:

void readheader ( void )

    /**********************************************************************/
    /* Print out all the header keywords in all extensions of a FITS file */
    /**********************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */

    int status, nkeys, keypos, hdutype, ii, jj;
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */
    char card[FLEN_CARD];   /* standard string lengths defined in fitsioc.h */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) ) 
         printerror( status );

    /* attempt to move to next HDU, until we get an EOF error */
    for (ii = 1; !(fits_movabs_hdu(fptr, ii, &hdutype, &status) ); ii++) 
    {
        /* get no. of keywords */
        if (fits_get_hdrpos(fptr, &nkeys, &keypos, &status) )
            printerror( status );

        printf("Header listing for HDU #%d:\n", ii);
        for (jj = 1; jj <= nkeys; jj++)  {
            if ( fits_read_record(fptr, jj, card, &status) )
                 printerror( status );

            printf("%s\n", card); /* print the keyword card */
        }
        printf("END\n\n");  /* terminate listing with END */
    }

    if (status == END_OF_FILE)   /* status values are defined in fitsioc.h */
        status = 0;              /* got the expected EOF error; reset = 0  */
    else
       printerror( status );     /* got an unexpected error                */

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}